

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

client * __thiscall rapic::client::operator=(client *this,client *rhs)

{
  time_t tVar1;
  connection_state cVar2;
  
  std::__cxx11::string::operator=((string *)this,(string *)rhs);
  std::__cxx11::string::operator=((string *)&this->service_,(string *)&rhs->service_);
  this->keepalive_period_ = rhs->keepalive_period_;
  this->inactivity_timeout_ = rhs->inactivity_timeout_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->filters_,&rhs->filters_);
  cVar2 = rhs->state_;
  this->socket_ = rhs->socket_;
  this->state_ = cVar2;
  tVar1 = rhs->last_activity_;
  this->last_keepalive_ = rhs->last_keepalive_;
  this->last_activity_ = tVar1;
  std::__cxx11::string::operator=((string *)&this->wbuffer_,(string *)&rhs->wbuffer_);
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::operator=
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&this->buffer_
             ,(__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&rhs->buffer_
            );
  this->capacity_ = rhs->capacity_;
  LOCK();
  (this->wcount_).super___atomic_base<unsigned_long>._M_i =
       (rhs->wcount_).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  LOCK();
  (this->rcount_).super___atomic_base<unsigned_long>._M_i =
       (rhs->rcount_).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  this->cur_type_ = rhs->cur_type_;
  this->cur_size_ = rhs->cur_size_;
  rhs->socket_ = -1;
  return this;
}

Assistant:

auto client::operator=(client&& rhs) noexcept -> client&
{
  address_ = std::move(rhs.address_);
  service_ = std::move(rhs.service_);
  keepalive_period_ = std::move(rhs.keepalive_period_);
  inactivity_timeout_ = std::move(rhs.inactivity_timeout_);
  filters_ = std::move(rhs.filters_);
  socket_ = rhs.socket_;
  state_ = rhs.state_;
  last_keepalive_ = rhs.last_keepalive_;
  last_activity_ = rhs.last_activity_;
  wbuffer_ = std::move(rhs.wbuffer_);
  buffer_ = std::move(rhs.buffer_);
  capacity_ = rhs.capacity_;
  wcount_ = rhs.wcount_.load();
  rcount_ = rhs.rcount_.load();
  cur_type_ = std::move(rhs.cur_type_);
  cur_size_ = std::move(rhs.cur_size_);

  rhs.socket_ = -1;

  return *this;
}